

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_thread.cpp
# Opt level: O2

void __thiscall tst_thread::resolve(tst_thread *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  QThread *t1;
  bool bVar3;
  char cVar4;
  PromiseData<int> *this_00;
  RunFunctionTaskBase<void> *this_01;
  PromiseData<void> *this_02;
  undefined8 *puVar5;
  QObject *t2;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f8;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_e8;
  QPromiseBase<int> local_e0;
  int value;
  QPromiseBase<int> local_c8;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_b0;
  DecayedTuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
  tuple;
  QPromiseBase<void> local_88;
  QThread *source;
  QThread *target;
  QPromiseBase<void> local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QPromiseBase<void> local_38;
  
  value = -1;
  target = (QThread *)0x0;
  source = (QThread *)0x0;
  local_c8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118938;
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118968;
  local_e0.m_d.d = this_00;
  local_c8.m_d.d = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_e0);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_e0);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_f8.d = (Data *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)&source;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8 = resolver.m_d.d;
  local_b0 = resolver.m_d.d;
  local_58._M_unused._0_8_ = (undefined8)QThreadPool::globalInstance();
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
  ._M_head_impl.source = (QThread **)resolver_1.m_d.d;
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
  ._M_head_impl.resolve.m_resolver.m_d.d = (PromiseResolver<int>)(PromiseResolver<int>)local_b0.d;
  if (local_b0.d != (Data *)0x0) {
    LOCK();
    ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58._8_8_ = (ulong)(uint)local_58._12_4_ << 0x20;
  this_01 = (RunFunctionTaskBase<void> *)operator_new(0x30);
  QtConcurrent::RunFunctionTaskBase<void>::RunFunctionTaskBase(this_01);
  *(undefined ***)this_01 = &PTR_run_00118800;
  *(QThread ***)(this_01 + 1) =
       tuple.
       super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
       .
       super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
       ._M_head_impl.source;
  *(PromiseResolver<int> *)&this_01[1].field_0x8 =
       tuple.
       super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
       .
       super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
       ._M_head_impl.resolve.m_resolver.m_d.d;
  if ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
      tuple.
      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
      .
      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
      ._M_head_impl.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
    LOCK();
    *(int *)tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
            ._M_head_impl.resolve.m_resolver.m_d.d =
         *(int *)tuple.
                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
                 .
                 super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
                 ._M_head_impl.resolve.m_resolver.m_d.d + 1;
    UNLOCK();
  }
  QtConcurrent::RunFunctionTaskBase<void>::start
            ((QFuture<void> *)&local_68,this_01,(TaskStartParameters *)&local_58);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &tuple.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
              ._M_head_impl.resolve);
  QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)&local_68);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_b0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_e8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_c8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118968;
  local_88._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118908;
  this_02 = (PromiseData<void> *)operator_new(0x58);
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_02->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_02);
  LOCK();
  pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_02 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a20;
  local_88.m_d.d = this_02;
  local_68.m_d.d = this_02;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&local_68);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_68);
  QVar2.d = local_c8.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_e0._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_e0._vptr_QPromiseBase = (_func_int **)resolver_1;
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if ((Data *)local_e0._vptr_QPromiseBase == (Data *)0x0) {
    local_e8.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_e0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_e0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_e8.d = (Data *)local_e0._vptr_QPromiseBase;
  }
  local_f8.d = (Data *)0x0;
  if ((Data *)local_e0._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((Data *)local_e0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_e0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_e8.d != (Data *)0x0) {
    LOCK();
    *(int *)local_e8.d = *(int *)local_e8.d + 1;
    UNLOCK();
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
  ._M_head_impl.source = (QThread **)local_e0._vptr_QPromiseBase;
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
  ._M_head_impl.resolve.m_resolver.m_d.d = (PromiseResolver<int>)(PromiseResolver<int>)local_e8.d;
  puVar5 = (undefined8 *)operator_new(0x20);
  *puVar5 = tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
            ._M_head_impl.source;
  if (tuple.
      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
      .
      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
      ._M_head_impl.source != (QThread **)0x0) {
    LOCK();
    *(int *)tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
            ._M_head_impl.source =
         *(int *)tuple.
                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
                 .
                 super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
                 ._M_head_impl.source + 1;
    UNLOCK();
  }
  puVar5[1] = tuple.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
              ._M_head_impl.resolve.m_resolver.m_d.d;
  if ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
      tuple.
      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
      .
      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
      ._M_head_impl.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
    LOCK();
    *(int *)tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
            ._M_head_impl.resolve.m_resolver.m_d.d =
         *(int *)tuple.
                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41)>
                 .
                 super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:37:41),_false>
                 ._M_head_impl.resolve.m_resolver.m_d.d + 1;
    UNLOCK();
  }
  puVar5[2] = &target;
  puVar5[3] = &value;
  pcStack_40 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_58._M_unused._M_object = puVar5;
  QtPromisePrivate::PromiseHandler<int,tst_thread::resolve()::$_1,int>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_thread::resolve()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)&tuple);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QVar2.d = local_c8.m_d.d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&tuple,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_e0,
             (QPromiseResolve<void> *)&local_e8,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&tuple);
  std::_Function_base::~_Function_base((_Function_base *)&tuple);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_e8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  local_88._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a20;
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_c8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_c8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_88);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_38);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_88);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_c8);
  cVar4 = QTest::qVerify(source != (QThread *)0x0,"source != nullptr","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x30);
  if (cVar4 != '\0') {
    cVar4 = QTest::qVerify(source != target,"source != target","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                           ,0x31);
    t1 = target;
    if (cVar4 != '\0') {
      t2 = (QObject *)QThread::currentThread();
      bVar3 = QTest::compare_ptr_helper
                        ((QObject *)t1,t2,"target","QThread::currentThread()",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x32);
      if (bVar3) {
        QTest::qCompare(value,0x2a,"value","42",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                        ,0x33);
      }
    }
  }
  return;
}

Assistant:

void tst_thread::resolve()
{
    int value = -1;
    QThread* target = nullptr;
    QThread* source = nullptr;

    QtPromise::QPromise<int>{[&](const QtPromise::QPromiseResolve<int>& resolve) {
        std::ignore = QtConcurrent::run([=, &source]() {
            source = QThread::currentThread();
            resolve(42);
        });
    }}
        .then([&](int res) {
            target = QThread::currentThread();
            value = res;
        })
        .wait();

    QVERIFY(source != nullptr);
    QVERIFY(source != target);
    QCOMPARE(target, QThread::currentThread());
    QCOMPARE(value, 42);
}